

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Simplex_tree.h
# Opt level: O0

Simplex_handle __thiscall
Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_full_featured>::
find<std::vector<int,std::allocator<int>>>
          (Simplex_tree<Gudhi::Simplex_tree_options_full_featured> *this,
          vector<int,_std::allocator<int>_> *s)

{
  bool bVar1;
  iterator __first;
  iterator __last;
  vector<int,_std::allocator<int>_> *in_RDX;
  allocator<int> local_59;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> local_58;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> local_50;
  undefined1 local_48 [8];
  vector<int,_std::allocator<int>_> copy;
  const_iterator last;
  const_iterator first;
  vector<int,_std::allocator<int>_> *s_local;
  Simplex_tree<Gudhi::Simplex_tree_options_full_featured> *this_local;
  
  last = std::begin<std::vector<int,std::allocator<int>>>(in_RDX);
  copy.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)std::end<std::vector<int,std::allocator<int>>>(in_RDX);
  bVar1 = __gnu_cxx::operator==
                    (&last,(__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                            *)&copy.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage);
  if (bVar1) {
    null_simplex();
  }
  else {
    local_50._M_current = last._M_current;
    local_58._M_current =
         copy.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_end_of_storage;
    std::allocator<int>::allocator(&local_59);
    std::vector<int,std::allocator<int>>::
    vector<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,void>
              ((vector<int,std::allocator<int>> *)local_48,local_50,local_58,&local_59);
    std::allocator<int>::~allocator(&local_59);
    __first = std::begin<std::vector<int,std::allocator<int>>>
                        ((vector<int,_std::allocator<int>_> *)local_48);
    __last = std::end<std::vector<int,std::allocator<int>>>
                       ((vector<int,_std::allocator<int>_> *)local_48);
    std::sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
              ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)__first._M_current
               ,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)__last._M_current
              );
    find_simplex(this,s);
    std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_48);
  }
  return (tree_iterator<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_full_featured>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_false>
          )(tree_iterator<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_full_featured>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_false>
            )this;
}

Assistant:

Simplex_handle find(const InputVertexRange & s) const {
    auto first = std::begin(s);
    auto last = std::end(s);

    if (first == last)
      return null_simplex();  // ----->>

    // Copy before sorting
    std::vector<Vertex_handle> copy(first, last);
    std::sort(std::begin(copy), std::end(copy));
    return find_simplex(copy);
  }